

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMaker.h
# Opt level: O2

string * ApprovalTests::StringMaker::toString<char[6]>
                   (string *__return_storage_ptr__,char (*contents) [6])

{
  stringstream s;
  stringstream asStack_198 [16];
  ostream local_188;
  
  ::std::__cxx11::stringstream::stringstream(asStack_198);
  ::std::operator<<(&local_188,*contents);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string toString(const T& contents)
        {
            std::stringstream s;
            s << contents;
            return s.str();
        }